

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void * mz_zip_reader_extract_to_heap
                 (mz_zip_archive *pZip,mz_uint file_index,size_t *pSize,mz_uint flags)

{
  uint uVar1;
  mz_bool mVar2;
  ulong local_78;
  void *pBuf;
  mz_uint8 *p;
  mz_uint64 alloc_size;
  mz_uint64 uncomp_size;
  mz_uint64 comp_size;
  mz_uint flags_local;
  size_t *pSize_local;
  mz_uint file_index_local;
  mz_zip_archive *pZip_local;
  long local_10;
  
  if ((((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
      (pZip->m_total_files <= file_index)) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    local_10 = 0;
  }
  else {
    local_10 = (long)(pZip->m_pState->m_central_dir).m_p +
               (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p +
                               (ulong)file_index * 4);
  }
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if (local_10 == 0) {
    pZip_local = (mz_zip_archive *)0x0;
  }
  else {
    uVar1 = *(uint *)(local_10 + 0x18);
    if ((flags & 0x400) != 0) {
      uVar1 = *(uint *)(local_10 + 0x14);
    }
    local_78 = (ulong)uVar1;
    pZip_local = (mz_zip_archive *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_78);
    if (pZip_local == (mz_zip_archive *)0x0) {
      pZip_local = (mz_zip_archive *)0x0;
    }
    else {
      mVar2 = mz_zip_reader_extract_to_mem(pZip,file_index,pZip_local,local_78,flags);
      if (mVar2 == 0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pZip_local);
        pZip_local = (mz_zip_archive *)0x0;
      }
      else if (pSize != (size_t *)0x0) {
        *pSize = local_78;
      }
    }
  }
  return pZip_local;
}

Assistant:

void *mz_zip_reader_extract_to_heap(mz_zip_archive *pZip, mz_uint file_index,
                                    size_t *pSize, mz_uint flags) {
  mz_uint64 comp_size, uncomp_size, alloc_size;
  const mz_uint8 *p = mz_zip_reader_get_cdh(pZip, file_index);
  void *pBuf;

  if (pSize)
    *pSize = 0;
  if (!p)
    return NULL;

  comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);

  alloc_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? comp_size : uncomp_size;
#ifdef _MSC_VER
  if (((0, sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF))
#else
  if (((sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF))
#endif
    return NULL;
  if (NULL ==
      (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)alloc_size)))
    return NULL;

  if (!mz_zip_reader_extract_to_mem(pZip, file_index, pBuf, (size_t)alloc_size,
                                    flags)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
    return NULL;
  }

  if (pSize)
    *pSize = (size_t)alloc_size;
  return pBuf;
}